

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
getLocalOptionValues
          (HighsLogOptions *report_log_options,string *option,
          vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
          string *current_value,string *default_value)

{
  const_reference ppOVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string *in_RCX;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_RDX;
  HighsLogOptions *in_RDI;
  string *in_R8;
  OptionRecordString *option_record;
  HighsOptionType type;
  OptionStatus status;
  HighsInt index;
  HighsInt *in_stack_ffffffffffffff70;
  vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  HighsLogOptions *in_stack_ffffffffffffff88;
  value_type pOVar4;
  string local_60 [12];
  HighsOptionType in_stack_ffffffffffffffac;
  int local_34;
  OptionStatus local_4;
  
  local_4 = getOptionIndex(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  if (local_4 == kOk) {
    ppOVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                        (in_RDX,(long)local_34);
    if ((*ppOVar1)->type == kString) {
      ppOVar1 = std::vector<OptionRecord_*,_std::allocator<OptionRecord_*>_>::operator[]
                          (in_RDX,(long)local_34);
      pOVar4 = *ppOVar1;
      if (in_RCX != (string *)0x0) {
        std::__cxx11::string::operator=(in_RCX,(string *)pOVar4[1]._vptr_OptionRecord);
      }
      if (in_R8 != (string *)0x0) {
        std::__cxx11::string::operator=(in_R8,(string *)&pOVar4[1].type);
      }
      local_4 = kOk;
    }
    else {
      uVar2 = std::__cxx11::string::c_str();
      optionEntryTypeToString_abi_cxx11_(in_stack_ffffffffffffffac);
      uVar3 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,
                   "getLocalOptionValue: Option \"%s\" requires value of type %s, not string\n",
                   uVar2,uVar3);
      std::__cxx11::string::~string(local_60);
      local_4 = kIllegalValue;
    }
  }
  return local_4;
}

Assistant:

OptionStatus getLocalOptionValues(
    const HighsLogOptions& report_log_options, const std::string& option,
    const std::vector<OptionRecord*>& option_records,
    std::string* current_value, std::string* default_value) {
  HighsInt index;
  OptionStatus status =
      getOptionIndex(report_log_options, option, option_records, index);
  if (status != OptionStatus::kOk) return status;
  HighsOptionType type = option_records[index]->type;
  if (type != HighsOptionType::kString) {
    highsLogUser(report_log_options, HighsLogType::kError,
                 "getLocalOptionValue: Option \"%s\" requires value of type "
                 "%s, not string\n",
                 option.c_str(), optionEntryTypeToString(type).c_str());
    return OptionStatus::kIllegalValue;
  }
  OptionRecordString& option_record =
      ((OptionRecordString*)option_records[index])[0];
  if (current_value) *current_value = *(option_record.value);
  if (default_value) *default_value = option_record.default_value;
  return OptionStatus::kOk;
}